

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void charls::transform_line<charls::transform_hp2<unsigned_char>,unsigned_char>
               (quad<unsigned_char> *destination,quad<unsigned_char> *source,size_t pixel_count,
               transform_hp2<unsigned_char> *transform,uint32_t mask)

{
  triplet<unsigned_char> tVar1;
  size_t i;
  size_t sVar2;
  
  for (sVar2 = 0; pixel_count != sVar2; sVar2 = sVar2 + 1) {
    tVar1 = transform_hp2<unsigned_char>::operator()
                      (transform,source[sVar2].super_triplet<unsigned_char>.field_0.v1 & mask,
                       source[sVar2].super_triplet<unsigned_char>.field_1.v2 & mask,
                       source[sVar2].super_triplet<unsigned_char>.field_2.v3 & mask);
    destination[sVar2] =
         (quad<unsigned_char>)
         ((uint)(uint3)tVar1 | ((uint)source[sVar2].field_0.v4 & mask & 0xff) << 0x18);
  }
  return;
}

Assistant:

void transform_line(quad<PixelType>* destination, const quad<PixelType>* source, const size_t pixel_count,
                    Transform& transform, const uint32_t mask) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] =
            quad<PixelType>(transform(source[i].v1 & mask, source[i].v2 & mask, source[i].v3 & mask), source[i].v4 & mask);
    }
}